

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

void learn(lda *l,single_learner *param_2,example *ec)

{
  pointer *ppiVar1;
  byte bVar2;
  float *pfVar3;
  iterator __position;
  byte *pbVar4;
  int iVar5;
  uint64_t *puVar6;
  v_array<int> *this;
  ulong uVar7;
  float *pfVar8;
  index_feature temp;
  example *local_68;
  float fStack_60;
  undefined4 uStack_5c;
  uint64_t local_58;
  byte *local_50;
  byte *local_48;
  v_array<int> *local_40;
  vector<index_feature,std::allocator<index_feature>> *local_38;
  
  uVar7 = (long)(l->examples)._end - (long)(l->examples)._begin >> 3;
  local_68 = ec;
  v_array<example_*>::push_back(&l->examples,&local_68);
  this = &l->doc_lengths;
  local_68 = (example *)((ulong)local_68 & 0xffffffff00000000);
  v_array<int>::push_back(this,(int *)&local_68);
  iVar5 = (int)uVar7;
  pbVar4 = (ec->super_example_predict).indices._begin;
  local_50 = (ec->super_example_predict).indices._end;
  if (pbVar4 != local_50) {
    local_38 = (vector<index_feature,std::allocator<index_feature>> *)&l->sorted_features;
    local_40 = this;
    do {
      bVar2 = *pbVar4;
      pfVar8 = (ec->super_example_predict).feature_space[bVar2].values._begin;
      pfVar3 = (ec->super_example_predict).feature_space[bVar2].values._end;
      local_48 = pbVar4;
      if (pfVar8 != pfVar3) {
        puVar6 = (ec->super_example_predict).feature_space[bVar2].indicies._begin;
        do {
          local_68 = (example *)CONCAT44(local_68._4_4_,iVar5);
          fStack_60 = *pfVar8;
          local_58 = *puVar6;
          __position._M_current =
               (l->sorted_features).
               super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<index_feature,std::allocator<index_feature>>::
            _M_realloc_insert<index_feature_const&>(local_38,__position,(index_feature *)&local_68);
            this = local_40;
          }
          else {
            ((__position._M_current)->f).weight_index = local_58;
            *(example **)__position._M_current = local_68;
            *(ulong *)&(__position._M_current)->f = CONCAT44(uStack_5c,fStack_60);
            ppiVar1 = &(l->sorted_features).
                       super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppiVar1 = *ppiVar1 + 1;
          }
          this->_begin[uVar7 & 0xffffffff] = this->_begin[uVar7 & 0xffffffff] + (int)*pfVar8;
          pfVar8 = pfVar8 + 1;
          puVar6 = puVar6 + 1;
        } while (pfVar8 != pfVar3);
      }
      pbVar4 = local_48 + 1;
    } while (pbVar4 != local_50);
  }
  if ((ulong)(iVar5 + 1) == l->minibatch) {
    learn_batch(l);
  }
  return;
}

Assistant:

void learn(lda &l, LEARNER::single_learner &, example &ec)
{
  uint32_t num_ex = (uint32_t)l.examples.size();
  l.examples.push_back(&ec);
  l.doc_lengths.push_back(0);
  for (features &fs : ec)
  {
    for (features::iterator &f : fs)
    {
      index_feature temp = {num_ex, feature(f.value(), f.index())};
      l.sorted_features.push_back(temp);
      l.doc_lengths[num_ex] += (int)f.value();
    }
  }
  if (++num_ex == l.minibatch)
    learn_batch(l);
}